

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O2

void __thiscall license::FullLicenseInfo::toLicenseInfo(FullLicenseInfo *this,LicenseInfo *license)

{
  bool bVar1;
  uint uVar2;
  time_t __time1;
  time_t __time0;
  double dVar3;
  
  if (license != (LicenseInfo *)0x0) {
    strncpy(license->proprietary_data,(this->extra_data)._M_dataplus._M_p,0x10);
    license->linked_to_pc = this->has_client_sig;
    bVar1 = this->has_expiry;
    license->has_expiry = bVar1;
    if (bVar1 == false) {
      license->expiry_date[0] = '\0';
      uVar2 = 999999;
    }
    else {
      strncpy(license->expiry_date,(this->to_date)._M_dataplus._M_p,0xb);
      __time1 = seconds_from_epoch((this->to_date)._M_dataplus._M_p);
      __time0 = time((time_t *)0x0);
      dVar3 = difftime(__time1,__time0);
      dVar3 = round(dVar3 / 86400.0);
      uVar2 = (uint)(long)dVar3;
    }
    license->days_left = uVar2;
  }
  return;
}

Assistant:

void FullLicenseInfo::toLicenseInfo(LicenseInfo* license) const {
	if (license != NULL) {
		strncpy(license->proprietary_data, extra_data.c_str(),
		PROPRIETARY_DATA_SIZE);

		license->linked_to_pc = has_client_sig;
		license->has_expiry = has_expiry;
		if (!has_expiry) {
			license->expiry_date[0] = '\0';
			license->days_left = 999999;
		} else {
			strncpy(license->expiry_date, to_date.c_str(), 11);
			double secs = difftime(
				seconds_from_epoch(to_date.c_str()),
				time(NULL));
			license->days_left = round(secs / (60 * 60 * 24));
		}
	}
}